

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_ManUtilSkipUntil(Prs_Man_t *p,char c)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar3 = p->pLimit;
  pcVar5 = p->pCur;
  iVar4 = 0;
LAB_003ef41e:
  if (pcVar5 < pcVar3) {
    if (*pcVar5 == '/') goto LAB_003ef439;
    if (*pcVar5 != ';') goto LAB_003ef48c;
    iVar4 = 1;
  }
  return iVar4;
LAB_003ef439:
  if (pcVar5[1] == '*') {
    pcVar5 = pcVar5 + 2;
    p->pCur = pcVar5;
    if (pcVar5 < pcVar3) {
      do {
        if ((*pcVar5 == '*') && (pcVar5[1] == '/')) {
          pcVar5 = pcVar5 + 2;
          goto LAB_003ef4b1;
        }
        pcVar5 = pcVar5 + 1;
        p->pCur = pcVar5;
      } while (pcVar5 != pcVar3);
    }
  }
  else if (pcVar5[1] == '/') {
    pcVar5 = pcVar5 + 2;
    p->pCur = pcVar5;
    if (pcVar5 < pcVar3) {
      do {
        cVar2 = *pcVar5;
        pcVar5 = pcVar5 + 1;
        p->pCur = pcVar5;
        if (cVar2 == '\n') goto LAB_003ef41e;
      } while (pcVar5 != pcVar3);
    }
  }
LAB_003ef48c:
  if (*pcVar5 == '\\') {
    pcVar5 = pcVar5 + 1;
    do {
      p->pCur = pcVar5;
      if (pcVar3 <= pcVar5) goto LAB_003ef4ab;
      pcVar1 = pcVar5 + 1;
      cVar2 = *pcVar5;
      pcVar5 = pcVar1;
    } while (cVar2 != ' ');
  }
  else {
LAB_003ef4ab:
    pcVar5 = pcVar5 + 1;
  }
LAB_003ef4b1:
  p->pCur = pcVar5;
  goto LAB_003ef41e;
}

Assistant:

static inline int Prs_ManUtilSkipUntil( Prs_Man_t * p, char c )
{
    while ( p->pCur < p->pLimit )
    {
        if ( Prs_ManIsChar(p, c) )
            return 1;
        if ( Prs_ManUtilSkipComments(p) )
            continue;
        if ( Prs_ManUtilSkipName(p) )
            continue;
        p->pCur++;
    }
    return 0;
}